

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O0

void __thiscall QWidgetTextControlPrivate::gotoNextTableCell(QWidgetTextControlPrivate *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long in_FS_OFFSET;
  int newRow;
  int newColumn;
  QTextTable *table;
  QTextTableCell cell;
  QTextCursor *in_stack_ffffffffffffff78;
  QTextTableCell *o;
  QTextCursor local_30 [8];
  QTextTableCell local_28 [16];
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = QTextCursor::currentTable();
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QTextTable::cellAt((QTextCursor *)&local_18);
  iVar2 = QTextTableCell::column();
  iVar3 = QTextTableCell::columnSpan();
  iVar4 = QTextTableCell::row();
  iVar5 = QTextTable::columns();
  if ((iVar5 <= iVar2 + iVar3) && (iVar2 = QTextTable::rows(), iVar2 <= iVar4 + 1)) {
    iVar2 = QTextTable::rows();
    QTextTable::insertRows(iVar1,iVar2);
  }
  o = local_28;
  QTextTable::cellAt((int)o,iVar1);
  QTextTableCell::operator=((QTextTableCell *)&local_18,o);
  QTextTableCell::~QTextTableCell(o);
  QTextTableCell::firstCursorPosition();
  QTextCursor::operator=((QTextCursor *)o,in_stack_ffffffffffffff78);
  QTextCursor::~QTextCursor(local_30);
  QTextTableCell::~QTextTableCell((QTextTableCell *)&local_18);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetTextControlPrivate::gotoNextTableCell()
{
    QTextTable *table = cursor.currentTable();
    QTextTableCell cell = table->cellAt(cursor);

    int newColumn = cell.column() + cell.columnSpan();
    int newRow = cell.row();

    if (newColumn >= table->columns()) {
        newColumn = 0;
        ++newRow;
        if (newRow >= table->rows())
            table->insertRows(table->rows(), 1);
    }

    cell = table->cellAt(newRow, newColumn);
    cursor = cell.firstCursorPosition();
}